

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

string * __thiscall
cfd::core::TapBranch::ToString_abi_cxx11_(string *__return_storage_ptr__,TapBranch *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined **ppuVar2;
  string *psVar3;
  pointer puVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  HashUtil *pHVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  _func_int **pp_Var10;
  size_type *psVar11;
  ulong *puVar12;
  ulong __n;
  ulong uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar17;
  pointer this_00;
  bool bVar18;
  string buf;
  string ver_str;
  ByteData256 hash;
  ByteData tapbranch_base;
  ByteData256 node;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  _func_int *p_Stack_158;
  pointer puStack_150;
  string *local_138;
  string local_130;
  undefined1 local_110 [40];
  string local_e8;
  ByteData256 local_c8;
  pointer local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  ByteData local_78;
  ByteData256 local_60;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_48;
  
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_138 = __return_storage_ptr__;
  if (this->has_leaf_ == true) {
    ppuVar2 = (undefined **)(local_110 + 0x10);
    local_110._8_8_ = 0;
    local_110[0x10] = '\0';
    local_110._0_8_ = ppuVar2;
    if (this->leaf_version_ != 0xc0) {
      ByteData::ByteData((ByteData *)&local_1c8,this->leaf_version_);
      ByteData::GetHex_abi_cxx11_(&local_188,(ByteData *)&local_1c8);
      plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x5e7c57);
      pp_Var10 = (_func_int **)(plVar6 + 2);
      if ((_func_int **)*plVar6 == pp_Var10) {
        p_Stack_158 = *pp_Var10;
        puStack_150 = (pointer)plVar6[3];
        local_168 = (undefined1  [8])&p_Stack_158;
      }
      else {
        p_Stack_158 = *pp_Var10;
        local_168 = (undefined1  [8])*plVar6;
      }
      uStack_160 = (pointer)plVar6[1];
      *plVar6 = (long)pp_Var10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_110,(string *)local_168);
      if (local_168 != (undefined1  [8])&p_Stack_158) {
        operator_delete((void *)local_168);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
    }
    Script::GetHex_abi_cxx11_(&local_130,&this->script_);
    ::std::operator+(&local_1c8,"tl(",&local_130);
    puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_1c8,local_110._0_8_);
    psVar11 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_188.field_2._M_allocated_capacity = *psVar11;
      local_188.field_2._8_8_ = puVar7[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar11;
      local_188._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_188._M_string_length = puVar7[1];
    *puVar7 = psVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_188);
    pp_Var10 = (_func_int **)(puVar7 + 2);
    if ((_func_int **)*puVar7 == pp_Var10) {
      p_Stack_158 = *pp_Var10;
      puStack_150 = (pointer)puVar7[3];
      local_168 = (undefined1  [8])&p_Stack_158;
    }
    else {
      p_Stack_158 = *pp_Var10;
      local_168 = (undefined1  [8])*puVar7;
    }
    uStack_160 = (pointer)puVar7[1];
    *puVar7 = pp_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_168);
    if (local_168 != (undefined1  [8])&p_Stack_158) {
      operator_delete((void *)local_168);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((undefined **)local_110._0_8_ != ppuVar2) {
LAB_00368749:
      operator_delete((void *)local_110._0_8_);
    }
  }
  else {
    if (((this->branch_list_).
         super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (this->branch_list_).
         super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (bVar18 = ByteData256::IsEmpty(&this->root_commitment_), bVar18)) {
      (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
      goto LAB_00368ee5;
    }
    ByteData256::GetHex_abi_cxx11_((string *)local_110,&this->root_commitment_);
    ::std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_110);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) goto LAB_00368749;
  }
  if ((this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) {
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&local_138->field_2 + 8) = local_1a8.field_2._8_8_;
    }
    else {
      (local_138->_M_dataplus)._M_p = local_1a8._M_dataplus._M_p;
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
    }
    local_138->_M_string_length = local_1a8._M_string_length;
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_local_buf[0] = '\0';
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  }
  else {
    GetBaseHash(&local_c8,this);
    if ((ToString[abi:cxx11]()::kTaggedHash == '\0') &&
       (iVar5 = __cxa_guard_acquire(&ToString[abi:cxx11]()::kTaggedHash), iVar5 != 0)) {
      local_110._0_8_ = local_110 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"TapBranch","");
      HashUtil::Sha256(&ToString::kTaggedHash,(string *)local_110);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_);
      }
      __cxa_atexit(ByteData256::~ByteData256,&ToString::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&ToString[abi:cxx11]()::kTaggedHash);
    }
    ByteData256::Concat<cfd::core::ByteData256>
              (&local_78,&ToString::kTaggedHash,&ToString::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&local_48,this);
    this_00 = (this->branch_list_).
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_b0 = (this->branch_list_).
               super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != local_b0) {
      paVar1 = &local_188.field_2;
      do {
        HashUtil::HashUtil((HashUtil *)local_168,'\x03');
        pHVar8 = HashUtil::operator<<((HashUtil *)local_168,&local_78);
        HashUtil::HashUtil((HashUtil *)local_110,pHVar8);
        local_168 = (undefined1  [8])&PTR__HashUtil_00740618;
        if (p_Stack_158 != (_func_int *)0x0) {
          operator_delete(p_Stack_158);
        }
        GetBranchHash(&local_60,this_00,
                      (char)((uint)(*(int *)&(this_00->branch_list_).
                                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                   *(int *)&(this_00->branch_list_).
                                            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11
                     );
        ByteData256::GetBytes(&local_90,&local_60);
        pvVar9 = ByteData256::GetBytes(&local_a8,&local_c8);
        uVar16 = (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar13 = (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        __n = uVar16;
        if (uVar13 < uVar16) {
          __n = uVar13;
        }
        if (__n == 0) {
          bVar18 = true;
        }
        else {
          iVar5 = memcmp(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,__n);
          bVar18 = iVar5 == 0;
          pvVar9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(long)iVar5;
        }
        pvVar17 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(uVar16 - uVar13);
        if (!bVar18) {
          pvVar17 = pvVar9;
        }
        if ((long)pvVar17 < 0) {
          pHVar8 = HashUtil::operator<<((HashUtil *)local_110,&local_c8);
          pHVar8 = HashUtil::operator<<(pHVar8,&local_60);
          HashUtil::Output256((ByteData256 *)local_168,pHVar8);
          puVar4 = local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_168;
          local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = uStack_160;
          local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)p_Stack_158;
          local_168 = (undefined1  [8])0x0;
          uStack_160._0_1_ = '\0';
          uStack_160._1_7_ = 0;
          p_Stack_158 = (_func_int *)0x0;
          if ((_func_int **)puVar4 != (_func_int **)0x0) {
            operator_delete(puVar4);
          }
          if (local_168 != (undefined1  [8])0x0) {
            operator_delete((void *)local_168);
          }
          ::std::operator+(&local_130,"{",&local_1a8);
          plVar6 = (long *)::std::__cxx11::string::append((char *)&local_130);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          puVar12 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1c8.field_2._M_allocated_capacity = *puVar12;
            local_1c8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar12;
            local_1c8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1c8._M_string_length = plVar6[1];
          *plVar6 = (long)puVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          ToString_abi_cxx11_(&local_e8,this_00);
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            uVar14 = local_1c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_1c8._M_string_length + local_e8._M_string_length) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              uVar14 = local_e8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_1c8._M_string_length + local_e8._M_string_length)
            goto LAB_00368c82;
            puVar7 = (undefined8 *)
                     ::std::__cxx11::string::replace
                               ((ulong)&local_e8,0,(char *)0x0,(ulong)local_1c8._M_dataplus._M_p);
          }
          else {
LAB_00368c82:
            puVar7 = (undefined8 *)
                     ::std::__cxx11::string::_M_append
                               ((char *)&local_1c8,(ulong)local_e8._M_dataplus._M_p);
          }
          psVar11 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_188.field_2._M_allocated_capacity = *psVar11;
            local_188.field_2._8_8_ = puVar7[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar11;
            local_188._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_188._M_string_length = puVar7[1];
          *puVar7 = psVar11;
          puVar7[1] = 0;
          *(undefined1 *)psVar11 = 0;
          puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_188);
          pp_Var10 = (_func_int **)(puVar7 + 2);
          if ((_func_int **)*puVar7 == pp_Var10) {
            p_Stack_158 = *pp_Var10;
            puStack_150 = (pointer)puVar7[3];
            local_168 = (undefined1  [8])&p_Stack_158;
          }
          else {
            p_Stack_158 = *pp_Var10;
            local_168 = (undefined1  [8])*puVar7;
          }
          uStack_160 = (pointer)puVar7[1];
          *puVar7 = pp_Var10;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_168);
          if (local_168 != (undefined1  [8])&p_Stack_158) {
            operator_delete((void *)local_168);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          psVar3 = &local_130;
          _Var15._M_p = local_130._M_dataplus._M_p;
        }
        else {
          pHVar8 = HashUtil::operator<<((HashUtil *)local_110,&local_60);
          pHVar8 = HashUtil::operator<<(pHVar8,&local_c8);
          HashUtil::Output256((ByteData256 *)local_168,pHVar8);
          puVar4 = local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_168;
          local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = uStack_160;
          local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)p_Stack_158;
          local_168 = (undefined1  [8])0x0;
          uStack_160._0_1_ = '\0';
          uStack_160._1_7_ = 0;
          p_Stack_158 = (_func_int *)0x0;
          if ((_func_int **)puVar4 != (_func_int **)0x0) {
            operator_delete(puVar4);
          }
          if (local_168 != (undefined1  [8])0x0) {
            operator_delete((void *)local_168);
          }
          ToString_abi_cxx11_(&local_e8,this_00);
          plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x5ec03a);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_130.field_2._M_allocated_capacity = *psVar11;
            local_130.field_2._8_8_ = plVar6[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar11;
            local_130._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_130._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_130);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          puVar12 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1c8.field_2._M_allocated_capacity = *puVar12;
            local_1c8.field_2._8_8_ = puVar7[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar12;
            local_1c8._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_1c8._M_string_length = puVar7[1];
          *puVar7 = puVar12;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)
                   ::std::__cxx11::string::_M_append
                             ((char *)&local_1c8,(ulong)local_1a8._M_dataplus._M_p);
          psVar11 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_188.field_2._M_allocated_capacity = *psVar11;
            local_188.field_2._8_8_ = puVar7[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar11;
            local_188._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_188._M_string_length = puVar7[1];
          *puVar7 = psVar11;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_188);
          pp_Var10 = (_func_int **)(puVar7 + 2);
          if ((_func_int **)*puVar7 == pp_Var10) {
            p_Stack_158 = *pp_Var10;
            puStack_150 = (pointer)puVar7[3];
            local_168 = (undefined1  [8])&p_Stack_158;
          }
          else {
            p_Stack_158 = *pp_Var10;
            local_168 = (undefined1  [8])*puVar7;
          }
          uStack_160 = (pointer)puVar7[1];
          *puVar7 = pp_Var10;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_168);
          if (local_168 != (undefined1  [8])&p_Stack_158) {
            operator_delete((void *)local_168);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          psVar3 = &local_e8;
          _Var15._M_p = local_e8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var15._M_p != &psVar3->field_2) {
          operator_delete(_Var15._M_p);
        }
        if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_110._0_8_ = &PTR__HashUtil_00740618;
        if ((void *)CONCAT71(local_110._17_7_,local_110[0x10]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_110._17_7_,local_110[0x10]));
        }
        this_00 = this_00 + 1;
      } while (this_00 != local_b0);
    }
    (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) {
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&local_138->field_2 + 8) = local_1a8.field_2._8_8_;
    }
    else {
      (local_138->_M_dataplus)._M_p = local_1a8._M_dataplus._M_p;
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,local_1a8.field_2._M_local_buf[0])
      ;
    }
    local_138->_M_string_length = local_1a8._M_string_length;
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_local_buf[0] = '\0';
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_48);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((_func_int **)
        local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_c8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
LAB_00368ee5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  return local_138;
}

Assistant:

std::string TapBranch::ToString() const {
  std::string buf;
  if (has_leaf_) {
    std::string ver_str;
    if (leaf_version_ != TaprootScriptTree::kTapScriptLeafVersion) {
      ver_str = "," + ByteData(leaf_version_).GetHex();
    }
    buf = "tl(" + script_.GetHex() + ver_str + ")";
  } else if (branch_list_.empty() && root_commitment_.IsEmpty()) {
    return "";
  } else {
    buf = root_commitment_.GetHex();
  }
  if (branch_list_.empty()) return buf;

  ByteData256 hash = GetBaseHash();
  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  for (const auto& branch : branch_list_) {
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto node = branch.GetCurrentBranchHash();
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
      buf = "{" + buf + "," + branch.ToString() + "}";
    } else {
      hash = (hasher << node << hash).Output256();
      buf = "{" + branch.ToString() + "," + buf + "}";
    }
  }
  return buf;
}